

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O1

void prf_material_palette_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode != prf_material_palette_info.opcode) {
    prf_error(9,"tried material palette entry method on node of type %d.");
    return;
  }
  if (state->material_palette == node || state->material_palette == (prf_node_t *)0x0) {
    state->material_palette = node;
    return;
  }
  prf_error(9,"material palette entry: already registered a material palette");
  return;
}

Assistant:

static
void
prf_material_palette_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette entry method on node of type %d.",
            node->opcode );
        return;
    }

    if ( state->material_palette != NULL && state->material_palette != node ) {
        prf_error( 9,
            "material palette entry: already registered a material palette" );
        return;
    }

    state->material_palette = node;
}